

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolj.c
# Opt level: O0

int ffppnjj(fitsfile *fptr,long group,LONGLONG firstelem,LONGLONG nelem,LONGLONG *array,
           LONGLONG nulval,int *status)

{
  int iVar1;
  LONGLONG *in_RDI;
  LONGLONG unaff_retaddr;
  int *in_stack_00000008;
  int in_stack_00000014;
  long row;
  fitsfile *in_stack_ffffffffffffffa8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = fits_is_compressed_image(in_stack_ffffffffffffffa8,(int *)0x222ca6);
  if (iVar1 == 0) {
    ffpcnjj((fitsfile *)row,in_stack_00000014,(LONGLONG)in_stack_00000008,unaff_retaddr,
            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,nelem,
            (int *)firstelem);
    iVar1 = *in_stack_00000008;
  }
  else {
    ffpmsg((char *)0x222cb7);
    *in_stack_00000008 = 0x19d;
    iVar1 = 0x19d;
  }
  return iVar1;
}

Assistant:

int ffppnjj(fitsfile *fptr,  /* I - FITS file pointer                       */
            long  group,     /* I - group to write(1 = 1st group)           */
            LONGLONG  firstelem, /* I - first vector element to write(1 = 1st)  */
            LONGLONG  nelem,     /* I - number of values to write               */
            LONGLONG  *array, /* I - array of values that are written       */
            LONGLONG  nulval,    /* I - undefined pixel value                   */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of the
  FITS array is not the same as the array being written).  Any array values
  that are equal to the value of nulval will be replaced with the null
  pixel value that is appropriate for this column.
*/
{
    long row;

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        ffpmsg("writing TLONGLONG to compressed image is not supported");

        return(*status = DATA_COMPRESSION_ERR);
    }

    row=maxvalue(1,group);

    ffpcnjj(fptr, 2, row, firstelem, nelem, array, nulval, status);
    return(*status);
}